

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparison_operators.cpp
# Opt level: O0

bool duckdb::GreaterThan::Operation<double>(double *left,double *right)

{
  bool bVar1;
  double in_RSI;
  double in_RDI;
  
  bVar1 = GreaterThanFloat<double>(in_RDI,in_RSI);
  return bVar1;
}

Assistant:

bool GreaterThan::Operation(const double &left, const double &right) {
	return GreaterThanFloat<double>(left, right);
}